

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::back_to_ancestor(depth_first_traverser *this,group *g)

{
  bool bVar1;
  reference pvVar2;
  pointer pcVar3;
  group *pgVar4;
  group *in_RSI;
  depth_first_traverser *in_RDI;
  const_iterator *top;
  const_iterator *in_stack_ffffffffffffffe0;
  depth_first_traverser *this_00;
  
  this_00 = in_RDI;
  if (in_RSI != (group *)0x0) {
    while (bVar1 = std::
                   vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ::empty(&this_00->stack_), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar2 = std::
               vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ::back((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       *)in_stack_ffffffffffffffe0);
      in_stack_ffffffffffffffe0 = &pvVar2->cur;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
               ::operator->(in_stack_ffffffffffffffe0);
      bVar1 = child_t<clipp::parameter,_clipp::group>::is_group(pcVar3);
      if (bVar1) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                 ::operator->(in_stack_ffffffffffffffe0);
        pgVar4 = child_t<clipp::parameter,_clipp::group>::as_group(pcVar3);
        if (pgVar4 == in_RSI) {
          return in_RDI;
        }
      }
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::pop_back((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                  *)0x194a74);
    }
  }
  return in_RDI;
}

Assistant:

depth_first_traverser&
        back_to_ancestor(const group* g) {
            if(!g) return *this;
            while(!stack_.empty()) {
                const auto& top = stack_.back().cur;
                if(top->is_group() && &(top->as_group()) == g) return *this;
                stack_.pop_back();
            }
            return *this;
        }